

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O0

void duckdb::AggregateStateCombine(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  PhysicalType PVar1;
  PhysicalType PVar2;
  bool bVar3;
  reference pvVar4;
  LogicalType *pLVar5;
  undefined8 uVar6;
  idx_t iVar7;
  unsigned_long params;
  idx_t params_1;
  char *pcVar8;
  pointer src;
  Vector *in_RDX;
  DataChunk *in_RDI;
  anon_struct_16_3_d7536bce_for_pointer aVar9;
  anon_union_16_2_67f50693_for_value aVar10;
  anon_union_16_2_67f50693_for_value aVar11;
  AggregateInputData aggr_input_data;
  string_t *state1;
  string_t *state0;
  idx_t state1_idx;
  idx_t state0_idx;
  idx_t i;
  string_t *result_ptr;
  UnifiedVectorFormat state1_data;
  UnifiedVectorFormat state0_data;
  CombineState *local_state;
  ExportAggregateBindData *bind_data;
  LogicalType *in_stack_00000328;
  ExpressionState *in_stack_fffffffffffffd18;
  ExpressionState *in_stack_fffffffffffffd20;
  UnifiedVectorFormat *this;
  undefined8 in_stack_fffffffffffffd28;
  UnifiedVectorFormat *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  Vector *in_stack_fffffffffffffd40;
  string *msg;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Vector *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbd;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  IOException *in_stack_fffffffffffffdc0;
  ulong uVar12;
  UnifiedVectorFormat *in_stack_fffffffffffffde0;
  idx_t in_stack_fffffffffffffde8;
  Vector *in_stack_fffffffffffffdf0;
  optional_ptr<duckdb::FunctionData,_true> local_1d8;
  AggregateInputData local_1d0;
  undefined1 local_1b2;
  undefined1 local_1b1 [33];
  anon_union_16_2_67f50693_for_value local_190;
  anon_struct_16_3_d7536bce_for_pointer local_180;
  string_t *local_170;
  string_t *local_168;
  idx_t local_160;
  idx_t local_158;
  ulong local_150;
  string_t *local_148;
  UnifiedVectorFormat local_140;
  UnifiedVectorFormat local_f8;
  undefined1 local_a9;
  allocator local_51;
  string local_50 [32];
  FunctionLocalState *local_30;
  CombineState *local_28;
  ExportAggregateBindData *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = ExportAggregateBindData::GetFrom(in_stack_fffffffffffffd20);
  local_30 = (FunctionLocalState *)ExecuteFunctionState::GetFunctionState(in_stack_fffffffffffffd18)
  ;
  optional_ptr<duckdb::FunctionLocalState,_true>::operator->
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)in_stack_fffffffffffffd20);
  local_28 = FunctionLocalState::Cast<duckdb::CombineState>
                       ((FunctionLocalState *)in_stack_fffffffffffffd20);
  ArenaAllocator::Reset((ArenaAllocator *)in_stack_fffffffffffffd40);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
                      (size_type)in_stack_fffffffffffffd18);
  pLVar5 = Vector::GetType(pvVar4);
  PVar1 = LogicalType::InternalType(pLVar5);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
                      (size_type)in_stack_fffffffffffffd18);
  pLVar5 = Vector::GetType(pvVar4);
  PVar2 = LogicalType::InternalType(pLVar5);
  if (PVar1 != PVar2) {
    local_a9 = 1;
    uVar6 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_50,"Aggregate state combine type mismatch, expect %s, got %s",&local_51);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
                        (size_type)in_stack_fffffffffffffd18);
    Vector::GetType(pvVar4);
    LogicalType::ToString_abi_cxx11_(in_stack_00000328);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
                        (size_type)in_stack_fffffffffffffd18);
    Vector::GetType(pvVar4);
    LogicalType::ToString_abi_cxx11_(in_stack_00000328);
    IOException::IOException<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffdc0,
               (string *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,
                                 CONCAT15(in_stack_fffffffffffffdbd,
                                          CONCAT14(in_stack_fffffffffffffdbc,
                                                   in_stack_fffffffffffffdb8)))),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_a9 = 0;
    __cxa_throw(uVar6,&IOException::typeinfo,IOException::~IOException);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffd30);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffd30);
  vector<duckdb::Vector,_true>::operator[]
            ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
             (size_type)in_stack_fffffffffffffd18);
  DataChunk::size(local_8);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  vector<duckdb::Vector,_true>::operator[]
            ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd20,
             (size_type)in_stack_fffffffffffffd18);
  DataChunk::size(local_8);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  local_148 = FlatVector::GetData<duckdb::string_t>((Vector *)0x13dde5a);
  aVar9.ptr = local_180.ptr;
  aVar9.length = local_180.length;
  aVar9.prefix[0] = local_180.prefix[0];
  aVar9.prefix[1] = local_180.prefix[1];
  aVar9.prefix[2] = local_180.prefix[2];
  aVar9.prefix[3] = local_180.prefix[3];
  aVar10.pointer.ptr = (char *)in_stack_fffffffffffffd70;
  aVar10._0_8_ = in_stack_fffffffffffffd78;
  aVar11.pointer.ptr = (char *)in_stack_fffffffffffffd20;
  aVar11._0_8_ = in_stack_fffffffffffffd28;
  local_150 = 0;
  do {
    uVar12 = local_150;
    local_180 = aVar9;
    iVar7 = DataChunk::size(local_8);
    this = (UnifiedVectorFormat *)aVar11.pointer.ptr;
    if (iVar7 <= uVar12) {
      UnifiedVectorFormat::~UnifiedVectorFormat(this);
      UnifiedVectorFormat::~UnifiedVectorFormat(this);
      return;
    }
    local_158 = SelectionVector::get_index(local_f8.sel,local_150);
    local_160 = SelectionVector::get_index(local_140.sel,local_150);
    local_168 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_f8);
    local_168 = local_168 + local_158;
    local_170 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_140);
    local_170 = local_170 + local_160;
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(aVar11._0_8_,(idx_t)aVar11.pointer.ptr)
    ;
    if (bVar3) {
LAB_013ddfe0:
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (aVar11._0_8_,(idx_t)aVar11.pointer.ptr);
      if (bVar3) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (aVar11._0_8_,(idx_t)aVar11.pointer.ptr);
        if (!bVar3) {
          pcVar8 = string_t::GetData((string_t *)aVar11.pointer.ptr);
          const_char_ptr_cast<char>(pcVar8);
          aVar9 = (anon_struct_16_3_d7536bce_for_pointer)
                  StringVector::AddStringOrBlob
                            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                             (idx_t)in_stack_fffffffffffffd30);
          local_148[local_150].value.pointer = aVar9;
          goto LAB_013de4da;
        }
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (aVar11._0_8_,(idx_t)aVar11.pointer.ptr);
      if (!bVar3) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (aVar11._0_8_,(idx_t)aVar11.pointer.ptr);
        if (bVar3) {
          in_stack_fffffffffffffd80 = local_18;
          pcVar8 = string_t::GetData((string_t *)aVar11.pointer.ptr);
          const_char_ptr_cast<char>(pcVar8);
          aVar10.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddStringOrBlob
                         (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          (idx_t)in_stack_fffffffffffffd30);
          local_148[local_150].value.pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar10;
          aVar9 = local_180;
          local_190.pointer = aVar10.pointer;
          goto LAB_013de4da;
        }
      }
      iVar7 = string_t::GetSize(local_168);
      if (iVar7 != local_20->state_size) {
LAB_013de226:
        local_1b2 = 1;
        params = __cxa_allocate_exception(0x10);
        msg = (string *)local_1b1;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_1b1 + 1),
                   "Aggregate state size mismatch, expect %llu, got %llu and %llu",(allocator *)msg)
        ;
        iVar7 = local_20->state_size;
        params_1 = string_t::GetSize(local_168);
        string_t::GetSize(local_170);
        IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                  ((IOException *)aVar10.pointer.ptr,msg,params,params_1,iVar7);
        local_1b2 = 0;
        __cxa_throw(params,&IOException::typeinfo,IOException::~IOException);
      }
      iVar7 = string_t::GetSize(local_170);
      if (iVar7 != local_20->state_size) goto LAB_013de226;
      in_stack_fffffffffffffd40 =
           (Vector *)
           ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      aVar11.pointer.ptr);
      pcVar8 = string_t::GetData((string_t *)aVar11.pointer.ptr);
      memcpy(in_stack_fffffffffffffd40,pcVar8,local_20->state_size);
      in_stack_fffffffffffffd30 =
           (UnifiedVectorFormat *)
           ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      aVar11.pointer.ptr);
      in_stack_fffffffffffffd38 = string_t::GetData((string_t *)aVar11.pointer.ptr);
      memcpy(in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,local_20->state_size);
      optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_1d8,(FunctionData *)0x0);
      AggregateInputData::AggregateInputData
                (&local_1d0,local_1d8,&local_28->allocator,ALLOW_DESTRUCTIVE);
      (*(local_20->aggr).combine)(&local_28->state_vector0,&local_28->state_vector1,&local_1d0,1);
      src = ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       aVar11.pointer.ptr);
      const_char_ptr_cast<unsigned_char>(src);
      aVar11.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                      (idx_t)in_stack_fffffffffffffd30);
      local_148[local_150].value.pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar11;
      aVar9 = local_180;
    }
    else {
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (aVar11._0_8_,(idx_t)aVar11.pointer.ptr);
      if (bVar3) goto LAB_013ddfe0;
      FlatVector::SetNull(in_stack_fffffffffffffd80,aVar10._0_8_,aVar10.inlined.inlined[0xb]);
      aVar9 = local_180;
    }
LAB_013de4da:
    local_150 = local_150 + 1;
  } while( true );
}

Assistant:

static void AggregateStateCombine(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<CombineState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));

	D_ASSERT(input.data.size() == 2);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	D_ASSERT(input.data[0].GetType() == result.GetType());

	if (input.data[0].GetType().InternalType() != input.data[1].GetType().InternalType()) {
		throw IOException("Aggregate state combine type mismatch, expect %s, got %s",
		                  input.data[0].GetType().ToString(), input.data[1].GetType().ToString());
	}

	UnifiedVectorFormat state0_data, state1_data;
	input.data[0].ToUnifiedFormat(input.size(), state0_data);
	input.data[1].ToUnifiedFormat(input.size(), state1_data);

	auto result_ptr = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state0_idx = state0_data.sel->get_index(i);
		auto state1_idx = state1_data.sel->get_index(i);

		auto &state0 = UnifiedVectorFormat::GetData<string_t>(state0_data)[state0_idx];
		auto &state1 = UnifiedVectorFormat::GetData<string_t>(state1_data)[state1_idx];

		// if both are NULL, we return NULL. If either of them is not, the result is that one
		if (!state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		if (state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state0.GetData()), bind_data.state_size);
			continue;
		}
		if (!state0_data.validity.RowIsValid(state0_idx) && state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state1.GetData()), bind_data.state_size);
			continue;
		}

		// we actually have to combine
		if (state0.GetSize() != bind_data.state_size || state1.GetSize() != bind_data.state_size) {
			throw IOException("Aggregate state size mismatch, expect %llu, got %llu and %llu", bind_data.state_size,
			                  state0.GetSize(), state1.GetSize());
		}

		memcpy(local_state.state_buffer0.get(), state0.GetData(), bind_data.state_size);
		memcpy(local_state.state_buffer1.get(), state1.GetData(), bind_data.state_size);

		AggregateInputData aggr_input_data(nullptr, local_state.allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
		bind_data.aggr.combine(local_state.state_vector0, local_state.state_vector1, aggr_input_data, 1);

		result_ptr[i] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(local_state.state_buffer1.get()),
		                                              bind_data.state_size);
	}
}